

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encodings.hpp
# Opt level: O2

string_view __thiscall webfront::uri::URI::next(URI *this,string_view uri)

{
  size_type sVar1;
  size_t __pos;
  char *__str;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  string_view uri_local;
  
  uri_local._M_str = uri._M_str;
  uri_local._M_len = uri._M_len;
  bVar2 = next::step == 7;
  next::step = next::step + 1;
  if (bVar2) {
    next::step = 0;
  }
  switch(next::step) {
  case 0:
    __str = "://";
    goto LAB_0012bdf5;
  case 1:
    sVar1 = next::mark + 3;
    if ((this->scheme)._M_len == 0) {
      sVar1 = 0;
    }
    next::mark2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&uri_local,"/",sVar1);
    if (next::mark2 == 0xffffffffffffffff) {
      next::mark2 = uri_local._M_len - 1;
    }
    else if ((this->scheme)._M_len != 0) {
      __pos = next::mark + 3;
      sVar1 = (next::mark2 - next::mark) - 3;
      goto LAB_0012be62;
    }
LAB_0012bea5:
    return (string_view)ZEXT816(0);
  case 2:
    sVar1 = next::mark2 + 1;
    if ((this->scheme)._M_len == 0) {
      sVar1 = 0;
    }
    next::mark = std::basic_string_view<char,_std::char_traits<char>_>::find(&uri_local,"?",sVar1);
    if ((next::mark != 0xffffffffffffffff) ||
       (next::mark = std::basic_string_view<char,_std::char_traits<char>_>::find(&uri_local,"#",0),
       next::mark != 0xffffffffffffffff)) {
      sVar1 = next::mark - next::mark2;
      __pos = next::mark2;
      goto LAB_0012be62;
    }
    next::mark = uri_local._M_len - 1;
    __pos = next::mark2;
    break;
  case 3:
    next::mark2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (&uri_local,"#",next::mark + 1);
    if (next::mark2 != 0xffffffffffffffff) {
      __pos = next::mark + 1;
LAB_0012be54:
      sVar1 = next::mark2 + ~next::mark;
      goto LAB_0012be62;
    }
    next::mark2 = uri_local._M_len - 1;
    __pos = next::mark + 1;
    break;
  case 4:
    goto LAB_0012bd87;
  case 5:
    __str = "@";
LAB_0012bdf5:
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find(&uri_local,__str,0);
    next::mark = sVar1;
    if (sVar1 == 0xffffffffffffffff) {
switchD_0012bcba_default:
      return (string_view)ZEXT816(0);
    }
    __pos = 0;
    goto LAB_0012be62;
  case 6:
    next::mark2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (&uri_local,":",next::mark + 1);
    __pos = next::mark + 1;
    if (next::mark2 != 0xffffffffffffffff) goto LAB_0012be54;
    break;
  case 7:
    if (next::mark2 == 0xffffffffffffffff) goto LAB_0012bea5;
LAB_0012bd87:
    __pos = next::mark2 + 1;
    break;
  default:
    goto switchD_0012bcba_default;
  }
  sVar1 = 0xffffffffffffffff;
LAB_0012be62:
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&uri_local,__pos,sVar1);
  sVar4._M_len = bVar3._M_len;
  sVar4._M_str = bVar3._M_str;
  return sVar4;
}

Assistant:

std::string_view next(std::string_view uri) const {
        static constexpr size_t schem{0}, autho{1}, path_{2}, quer_{3}, fragm{4}, usrnf{5}, host_{6}, port_{7}, npos = std::string_view::npos; 
        static size_t step{port_}, mark{0}, mark2{0};
        step = (step == port_) ? schem : step + 1;
        switch (step) {
            case schem: mark = uri.find("://"); return mark == npos ? std::string_view{} : uri.substr(0, mark);
            case autho: mark2 = uri.find("/", scheme.empty() ? 0 : mark + 3);
                if (mark2 == npos) { mark2 = uri.size() - 1; return {}; }
                if (scheme.empty()) return {};
                return uri.substr(mark + 3, mark2 - mark - 3);
            case path_: mark = uri.find("?", scheme.empty() ? 0 : mark2 + 1);
                if (mark == npos) {
                    mark = uri.find("#");
                    if (mark == npos) { mark = uri.size() - 1; return uri.substr(mark2); }
                }
                return uri.substr(mark2, mark - mark2);
            case quer_: mark2 = uri.find("#", mark + 1);
                if (mark2 == npos) { mark2 = uri.size() - 1; return uri.substr(mark + 1); } else return uri.substr(mark + 1, mark2 - mark - 1);
            case fragm: return uri.substr(mark2 + 1);
            case usrnf: mark = uri.find("@");
                if (mark == npos) return {}; else return uri.substr(0, mark);
            case host_: mark2 = uri.find(":", mark + 1);
                if (mark2 == npos) return uri.substr(mark + 1); else return uri.substr(mark + 1, mark2 - mark - 1);
            case port_: if (mark2 != npos) return uri.substr(mark2 + 1);
        }
        return {};           
    }